

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QDockAreaLayoutItem * __thiscall
QDockAreaLayoutItem::operator=(QDockAreaLayoutItem *this,QDockAreaLayoutItem *other)

{
  QDockAreaLayoutInfo *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QPlaceHolderItem *pQVar4;
  Data *pDVar5;
  QMainWindow *pQVar6;
  QTabBar *pQVar7;
  Representation RVar8;
  DockPosition DVar9;
  Orientation OVar10;
  Representation RVar11;
  Representation RVar12;
  undefined7 uVar13;
  bool bVar14;
  undefined2 uVar15;
  int iVar16;
  QDockAreaLayoutInfo *pQVar17;
  QPlaceHolderItem *pQVar18;
  
  if (this != other) {
    this->widgetItem = other->widgetItem;
    pQVar1 = this->subinfo;
    if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&(pQVar1->item_list).d);
      pDVar2 = (pQVar1->separatorWidgets).d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((pQVar1->separatorWidgets).d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    operator_delete(pQVar1,0x70);
    pQVar1 = other->subinfo;
    if (pQVar1 == (QDockAreaLayoutInfo *)0x0) {
      pQVar17 = (QDockAreaLayoutInfo *)0x0;
    }
    else {
      pQVar17 = (QDockAreaLayoutInfo *)operator_new(0x70);
      pQVar17->sep = pQVar1->sep;
      pDVar2 = (pQVar1->separatorWidgets).d.d;
      (pQVar17->separatorWidgets).d.d = pDVar2;
      (pQVar17->separatorWidgets).d.ptr = (pQVar1->separatorWidgets).d.ptr;
      (pQVar17->separatorWidgets).d.size = (pQVar1->separatorWidgets).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      DVar9 = pQVar1->dockPos;
      OVar10 = pQVar1->o;
      RVar11.m_i = (pQVar1->rect).x1.m_i;
      RVar12.m_i = (pQVar1->rect).y1.m_i;
      RVar8.m_i = (pQVar1->rect).y2.m_i;
      pQVar6 = pQVar1->mainWindow;
      (pQVar17->rect).x2 = (Representation)(pQVar1->rect).x2.m_i;
      (pQVar17->rect).y2 = (Representation)RVar8.m_i;
      pQVar17->mainWindow = pQVar6;
      pQVar17->dockPos = DVar9;
      pQVar17->o = OVar10;
      (pQVar17->rect).x1 = (Representation)RVar11.m_i;
      (pQVar17->rect).y1 = (Representation)RVar12.m_i;
      pDVar3 = (pQVar1->item_list).d.d;
      (pQVar17->item_list).d.d = pDVar3;
      (pQVar17->item_list).d.ptr = (pQVar1->item_list).d.ptr;
      (pQVar17->item_list).d.size = (pQVar1->item_list).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar17->tabBarShape = pQVar1->tabBarShape;
      uVar13 = *(undefined7 *)&pQVar1->field_0x59;
      pQVar7 = pQVar1->tabBar;
      pQVar17->tabbed = pQVar1->tabbed;
      *(undefined7 *)&pQVar17->field_0x59 = uVar13;
      pQVar17->tabBar = pQVar7;
    }
    this->subinfo = pQVar17;
    pQVar4 = this->placeHolderItem;
    if ((pQVar4 != (QPlaceHolderItem *)0x0) &&
       (pDVar5 = (pQVar4->objectName).d.d, pDVar5 != (Data *)0x0)) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pQVar4->objectName).d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pQVar4,0x30);
    pQVar4 = other->placeHolderItem;
    if (pQVar4 == (QPlaceHolderItem *)0x0) {
      pQVar18 = (QPlaceHolderItem *)0x0;
    }
    else {
      pQVar18 = (QPlaceHolderItem *)operator_new(0x30);
      pDVar5 = (pQVar4->objectName).d.d;
      (pQVar18->objectName).d.d = pDVar5;
      (pQVar18->objectName).d.ptr = (pQVar4->objectName).d.ptr;
      (pQVar18->objectName).d.size = (pQVar4->objectName).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      (pQVar18->topLevelRect).y2.m_i = (pQVar4->topLevelRect).y2.m_i;
      bVar14 = pQVar4->window;
      uVar15 = *(undefined2 *)&pQVar4->field_0x1a;
      RVar8.m_i = (pQVar4->topLevelRect).x1.m_i;
      RVar11.m_i = (pQVar4->topLevelRect).y1.m_i;
      RVar12.m_i = (pQVar4->topLevelRect).x2.m_i;
      pQVar18->hidden = pQVar4->hidden;
      pQVar18->window = bVar14;
      *(undefined2 *)&pQVar18->field_0x1a = uVar15;
      (pQVar18->topLevelRect).x1 = (Representation)RVar8.m_i;
      (pQVar18->topLevelRect).y1 = (Representation)RVar11.m_i;
      (pQVar18->topLevelRect).x2 = (Representation)RVar12.m_i;
    }
    this->placeHolderItem = pQVar18;
    iVar16 = other->size;
    this->pos = other->pos;
    this->size = iVar16;
    this->flags = other->flags;
  }
  return this;
}

Assistant:

QDockAreaLayoutItem
    &QDockAreaLayoutItem::operator = (const QDockAreaLayoutItem &other)
{
    if (this == &other)
        return *this;

    widgetItem = other.widgetItem;
    delete subinfo;
    if (other.subinfo == nullptr)
        subinfo = nullptr;
    else
        subinfo = new QDockAreaLayoutInfo(*other.subinfo);

    delete placeHolderItem;
    if (other.placeHolderItem == nullptr)
        placeHolderItem = nullptr;
    else
        placeHolderItem = new QPlaceHolderItem(*other.placeHolderItem);

    pos = other.pos;
    size = other.size;
    flags = other.flags;

    return *this;
}